

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O1

int os_date(lua_State *L)

{
  lua_State *plVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  tm *stm;
  char *__s;
  size_t sVar4;
  char *option;
  char *pcVar5;
  int oplen;
  char cc [4];
  time_t t;
  luaL_Buffer b;
  char local_2064;
  undefined1 local_2063 [3];
  lua_State *local_2060;
  lua_Integer local_2058;
  luaL_Buffer local_2050;
  
  __s1 = luaL_optlstring(L,1,"%c",(size_t *)0x0);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    local_2058 = time((time_t *)0x0);
  }
  else {
    local_2058 = luaL_checkinteger(L,2);
  }
  local_2060 = L;
  if (*__s1 == '!') {
    stm = (tm *)gmtime(&local_2058);
    __s1 = __s1 + 1;
  }
  else {
    stm = (tm *)localtime(&local_2058);
  }
  if (stm == (tm *)0x0) {
    luaL_error(local_2060,"time result cannot be represented in this installation");
  }
  iVar2 = strcmp(__s1,"*t");
  plVar1 = local_2060;
  if (iVar2 == 0) {
    lua_createtable(local_2060,0,9);
    setallfields(plVar1,stm);
    return 1;
  }
  local_2064 = '%';
  luaL_buffinit(local_2060,&local_2050);
LAB_0011d011:
  for (; *__s1 != '%'; __s1 = __s1 + 1) {
    if (*__s1 == '\0') {
      luaL_pushresult(&local_2050);
      return 1;
    }
    if (local_2050.size <= local_2050.n) {
      luaL_prepbuffsize(&local_2050,1);
    }
    local_2050.b[local_2050.n] = *__s1;
    local_2050.n = local_2050.n + 1;
  }
  __s = luaL_prepbuffsize(&local_2050,0xfa);
  __s1 = __s1 + 1;
  iVar2 = 1;
  pcVar5 = "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
  do {
    plVar1 = local_2060;
    if (*pcVar5 == '|') {
      iVar2 = iVar2 + 1;
    }
    else {
      if (*pcVar5 == '\0') {
        pcVar5 = lua_pushfstring(local_2060,"invalid conversion specifier \'%%%s\'",__s1);
        luaL_argerror(plVar1,1,pcVar5);
        goto LAB_0011d0f0;
      }
      sVar4 = (size_t)iVar2;
      iVar3 = bcmp(__s1,pcVar5,sVar4);
      if (iVar3 == 0) break;
    }
    pcVar5 = pcVar5 + iVar2;
  } while( true );
  memcpy(local_2063,__s1,sVar4);
  local_2063[sVar4] = 0;
  __s1 = __s1 + sVar4;
LAB_0011d0f0:
  sVar4 = strftime(__s,0xfa,&local_2064,(tm *)stm);
  local_2050.n = local_2050.n + sVar4;
  goto LAB_0011d011;
}

Assistant:

static int os_date (lua_State *L) {
  const char *s = luaL_optstring(L, 1, "%c");
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    luaL_error(L, "time result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (*s) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s = checkoption(L, s + 1, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}